

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadPolH_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  iterator *this_00;
  Node *msh;
  _Map_pointer pppNVar1;
  _func_int **pp_Var2;
  _Elt_pointer ppNVar3;
  iterator __position;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  short sVar9;
  short sVar10;
  int iVar11;
  int iVar12;
  __normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>
  __tmp;
  VertexIndex __p;
  _Base_ptr p_Var13;
  Node *pNVar14;
  _Base_ptr p_Var15;
  undefined1 *puVar16;
  aiVector3D *v;
  _Map_pointer pppNVar17;
  _func_int **pp_Var18;
  long lVar19;
  size_type sVar20;
  long lVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar22;
  float fVar23;
  chunk_guard cn;
  string local_1e0;
  chunk_guard local_1c0;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  pointer local_198;
  pointer pVStack_190;
  
  if (8 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"PolH");
    return;
  }
  local_1c0.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  local_1c0.nfo = nfo;
  local_1c0.reader = reader;
  __p = (VertexIndex)operator_new(0x158);
  COB::Node::Node((Node *)__p,TYPE_MESH);
  *(undefined ***)__p = &PTR__Mesh_00821158;
  (((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)((long)__p + 0xd8))->
  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)__p + 0xe0) = (pointer)0x0;
  *(pointer *)((long)__p + 0xe8) = (pointer)0x0;
  (((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)((long)__p + 0xf0))->
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)__p + 0xf8) = (pointer)0x0;
  *(pointer *)((long)__p + 0x100) = (pointer)0x0;
  (((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)((long)__p + 0x108))->
  super__Vector_base<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)__p + 0x110) = (pointer)0x0;
  *(pointer *)((long)__p + 0x118) = (pointer)0x0;
  *(uint *)((long)__p + 0x120) = 1;
  p_Var15 = (_Base_ptr)((long)__p + 0x130);
  (((_Rb_tree_header *)((long)__p + 0x130))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)__p + 0x138) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)__p + 0x140) = p_Var15;
  *(_Base_ptr *)((long)__p + 0x148) = p_Var15;
  *(size_t *)((long)__p + 0x150) = 0;
  local_1e0._M_dataplus._M_p = (pointer)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::COB::Mesh*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e0._M_string_length,(Mesh *)__p);
  local_1a8 = (undefined1  [8])local_1e0._M_dataplus._M_p;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._M_string_length;
  local_1e0._M_dataplus._M_p = (pointer)0x0;
  local_1e0._M_string_length = 0;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,(shared_ptr<Assimp::COB::Node> *)local_1a8);
  if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
  }
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._M_string_length);
  }
  p_Var13 = (_Base_ptr)
            (out->nodes).
            super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (p_Var13 ==
      (_Base_ptr)
      (out->nodes).
      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    p_Var15 = (_Base_ptr)
              (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    p_Var13 = p_Var15[-1]._M_right + 0x10;
  }
  msh = (Node *)p_Var13[-1]._M_left;
  uVar5 = nfo->parent_id;
  uVar6 = nfo->version;
  uVar7 = nfo->size;
  (msh->super_ChunkInfo).id = nfo->id;
  (msh->super_ChunkInfo).parent_id = uVar5;
  (msh->super_ChunkInfo).version = uVar6;
  (msh->super_ChunkInfo).size = uVar7;
  ReadBasicNodeInfo_Binary((COBImporter *)this_01,msh,reader,(ChunkInfo *)p_Var15);
  iVar11 = StreamReader<false,_false>::Get<int>(reader);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&msh[1].type,
             (long)iVar11);
  pppNVar1 = msh[1].temp_children.
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_map;
  for (pppNVar17 = *(_Map_pointer *)&msh[1].type; pppNVar17 != pppNVar1;
      pppNVar17 = (_Map_pointer)((long)pppNVar17 + 0xc)) {
    fVar23 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)pppNVar17 = fVar23;
    fVar23 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)((long)pppNVar17 + 4) = fVar23;
    fVar23 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)(pppNVar17 + 1) = fVar23;
  }
  iVar11 = StreamReader<false,_false>::Get<int>(reader);
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(msh + 1),
             (long)iVar11);
  pp_Var2 = *(_func_int ***)&msh[1].super_ChunkInfo;
  for (pp_Var18 = msh[1]._vptr_Node; pp_Var18 != pp_Var2; pp_Var18 = pp_Var18 + 1) {
    fVar23 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)pp_Var18 = fVar23;
    fVar23 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)((long)pp_Var18 + 4) = fVar23;
  }
  iVar11 = StreamReader<false,_false>::Get<int>(reader);
  this_00 = &msh[1].temp_children.
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start;
  std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::reserve
            ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)this_00,(long)iVar11);
  if (iVar11 != 0) {
    sVar20 = 0;
    do {
      bVar8 = StreamReader<false,_false>::Get<signed_char>(reader);
      if ((bVar8 & 8) == 0) {
        local_198 = (pointer)0x0;
        pVStack_190 = (pointer)0x0;
        local_1a8._0_4_ = 0;
        local_1a8._4_4_ = 0;
        _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::
        emplace_back<Assimp::COB::Face>
                  ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)this_00,
                   (Face *)local_1a8);
        if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          operator_delete(_Stack_1a0._M_pi);
        }
      }
      else if (msh[1].temp_children.
               super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur ==
               msh[1].temp_children.
               super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[56]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [56])"A hole is the first entity in the `PolH` chunk with id ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        ThrowException(&local_1e0);
      }
      ppNVar3 = msh[1].temp_children.
                super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first;
      sVar9 = StreamReader<false,_false>::Get<short>(reader);
      lVar19 = (long)sVar9;
      std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::reserve
                ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
                 (ppNVar3 + -3),((long)ppNVar3[-2] - (long)ppNVar3[-3] >> 3) + lVar19);
      if ((bVar8 & 8) == 0) {
        sVar10 = StreamReader<false,_false>::Get<short>(reader);
        *(int *)(ppNVar3 + -4) = (int)sVar10;
        *(undefined4 *)((long)ppNVar3 + -0x1c) = 0;
      }
      lVar21 = lVar19;
      if (sVar9 != 0) {
        do {
          local_1a8._0_4_ = 0;
          local_1a8._4_4_ = 0;
          __position._M_current = (VertexIndex *)ppNVar3[-2];
          if ((Node *)__position._M_current == ppNVar3[-1]) {
            std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::
            _M_realloc_insert<Assimp::COB::VertexIndex>
                      ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                        *)(ppNVar3 + -3),__position,(VertexIndex *)local_1a8);
          }
          else {
            (__position._M_current)->pos_idx = 0;
            (__position._M_current)->uv_idx = 0;
            ppNVar3[-2] = (Node *)&ppNVar3[-2]->super_ChunkInfo;
          }
          pNVar14 = ppNVar3[-2];
          fVar23 = (float)StreamReader<false,_false>::Get<int>(reader);
          pNVar14[-1].unit_scale = fVar23;
          iVar12 = StreamReader<false,_false>::Get<int>(reader);
          *(int *)&pNVar14[-1].field_0xd4 = iVar12;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
      }
      if ((((bVar8 & 8) != 0) && (sVar9 != 0)) &&
         (pNVar14 = ppNVar3[-2], (Node *)((long)pNVar14 + lVar19 * -8 + 8) < pNVar14)) {
        puVar16 = (undefined1 *)((long)pNVar14 + lVar19 * -8 + 0x10);
        do {
          uVar4 = *(undefined8 *)&pNVar14[-1].unit_scale;
          *(undefined8 *)&pNVar14[-1].unit_scale = *(undefined8 *)(puVar16 + -0x10);
          pNVar14 = (Node *)&pNVar14[-1].unit_scale;
          *(undefined8 *)(puVar16 + -0x10) = uVar4;
          bVar22 = puVar16 < pNVar14;
          puVar16 = puVar16 + 8;
        } while (bVar22);
      }
      sVar20 = sVar20 + 1;
    } while (sVar20 != (long)iVar11);
  }
  if (4 < nfo->version) {
    iVar11 = StreamReader<false,_false>::Get<int>(reader);
    *(int *)&msh[1].temp_children.
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node = iVar11;
  }
  if ((nfo->version & 0xfffffffe) == 6) {
    StreamReader<false,_false>::Get<int>(reader);
  }
  chunk_guard::~chunk_guard(&local_1c0);
  return;
}

Assistant:

void COBImporter::ReadPolH_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Binary(reader,nfo,"PolH");
    }
    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::shared_ptr<Mesh>(new Mesh()));
    Mesh& msh = (Mesh&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);

    msh.vertex_positions.resize(reader.GetI4());
    for(aiVector3D& v : msh.vertex_positions) {
        v.x = reader.GetF4();
        v.y = reader.GetF4();
        v.z = reader.GetF4();
    }

    msh.texture_coords.resize(reader.GetI4());
    for(aiVector2D& v : msh.texture_coords) {
        v.x = reader.GetF4();
        v.y = reader.GetF4();
    }

    const size_t numf = reader.GetI4();
    msh.faces.reserve(numf);
    for(size_t i = 0; i < numf; ++i) {
        // XXX backface culling flag is 0x10 in flags

        // hole?
        bool hole;
        if ((hole = (reader.GetI1() & 0x08) != 0)) {
            // XXX Basically this should just work fine - then triangulator
            // should output properly triangulated data even for polygons
            // with holes. Test data specific to COB is needed to confirm it.
            if (msh.faces.empty()) {
                ThrowException(format("A hole is the first entity in the `PolH` chunk with id ") << nfo.id);
            }
        }
        else msh.faces.push_back(Face());
        Face& f = msh.faces.back();

        const size_t num = reader.GetI2();
        f.indices.reserve(f.indices.size() + num);

        if(!hole) {
            f.material = reader.GetI2();
            f.flags = 0;
        }

        for(size_t x = 0; x < num; ++x) {
            f.indices.push_back(VertexIndex());

            VertexIndex& v = f.indices.back();
            v.pos_idx = reader.GetI4();
            v.uv_idx = reader.GetI4();
        }

        if(hole) {
            std::reverse(f.indices.rbegin(),f.indices.rbegin()+num);
        }
    }
    if (nfo.version>4) {
        msh.draw_flags = reader.GetI4();
    }
    nfo.version>5 && nfo.version<8 ? reader.GetI4() : 0;
}